

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O1

void tcmalloc::SlowTLS::RegisterEntry(Result *result,Entry *entry)

{
  Entry **ppEVar1;
  Entry *pEVar2;
  bool bVar3;
  SpinLockHolder local_20;
  SpinLockHolder h;
  
  entry->thread_id = result->thread_id_;
  entry->prev = result->ht_place_;
  local_20.lock_ = &lock_;
  LOCK();
  bVar3 = (__atomic_base<int>)lock_.lockword_.super___atomic_base<int>._M_i ==
          (__atomic_base<int>)0x0;
  if (bVar3) {
    lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar3) {
    SpinLock::SlowLock(&lock_);
  }
  ppEVar1 = result->ht_place_;
  pEVar2 = *ppEVar1;
  entry->next = pEVar2;
  if (pEVar2 != (Entry *)0x0) {
    pEVar2->prev = &entry->next;
  }
  *ppEVar1 = entry;
  SpinLockHolder::~SpinLockHolder(&local_20);
  return;
}

Assistant:

static void RegisterEntry(Result* result, Entry* entry) {
    entry->thread_id = result->thread_id_;
    entry->prev = result->ht_place_;

    SpinLockHolder h(&lock_);

    Entry* next = entry->next = *result->ht_place_;
    if (next) {
      ASSERT(next->prev == result->ht_place_);
      next->prev = &entry->next;
    }
    *result->ht_place_ = entry;
  }